

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void __thiscall disruptor::test::BusySpinStrategy::WaitForCursor::test_method(WaitForCursor *this)

{
  bool bVar1;
  thread waiter;
  atomic<long> return_value;
  memory_order __b_1;
  memory_order __b;
  basic_cstring<const_char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  type *in_stack_fffffffffffffe88;
  thread *in_stack_fffffffffffffe90;
  undefined8 uVar2;
  undefined8 local_138;
  basic_cstring<const_char> local_130;
  undefined1 local_120 [40];
  undefined1 local_f8 [16];
  basic_cstring<const_char> local_e8 [2];
  undefined8 local_c8;
  basic_cstring<const_char> local_c0;
  undefined1 local_b0 [40];
  undefined1 local_88 [32];
  basic_cstring<const_char> local_68;
  undefined8 *local_50;
  undefined8 local_40 [2];
  undefined8 local_30;
  memory_order local_28;
  undefined4 local_24;
  undefined8 *local_20;
  undefined8 local_18;
  memory_order local_10;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_40[0] = 0xffffffffffffffff;
  local_50 = local_40;
  std::thread::thread<disruptor::test::BusySpinStrategy::WaitForCursor::test_method()::__0,,void>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_68,0x41,local_88);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe68,(char (*) [1])in_stack_fffffffffffffe60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_8 = local_40;
    local_c = 5;
    local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_18 = local_40[0];
    local_c8 = local_40[0];
    in_stack_fffffffffffffe68 = "kInitialCursorValue";
    in_stack_fffffffffffffe60 = (basic_cstring<const_char> *)&kInitialCursorValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b0,&local_c0,0x41,1,2,&local_c8,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x115dc3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::thread::thread<disruptor::test::BusySpinStrategy::WaitForCursor::test_method()::__1,,void>
            (in_stack_fffffffffffffe90,(type *)in_stack_fffffffffffffe88);
  std::thread::join();
  std::thread::~thread((thread *)0x115e1c);
  std::thread::join();
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_e8,0x47,local_f8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe68,(char (*) [1])in_stack_fffffffffffffe60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_20 = local_40;
    local_24 = 5;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_30 = local_40[0];
    local_138 = local_40[0];
    in_stack_fffffffffffffe68 = "kFirstSequenceValue";
    in_stack_fffffffffffffe60 = (basic_cstring<const_char> *)&kFirstSequenceValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_120,&local_130,0x47,1,2,&local_138,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x115fbc);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::thread::~thread((thread *)0x115fe2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(
        strategy.WaitFor(kFirstSequenceValue, cursor, dependents, alerted));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() {
    cursor.IncrementAndGet(1L);
    strategy.SignalAllWhenBlocking();
  }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}